

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EulerAngles.cpp
# Opt level: O3

KString * __thiscall
KDIS::DATA_TYPE::EulerAngles::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,EulerAngles *this)

{
  ostream *poVar1;
  KStringStream ss;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"Psi: ",5);
  poVar1 = std::ostream::_M_insert<double>((double)(float)this->m_f32Psi);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,",  Theta: ",10);
  poVar1 = std::ostream::_M_insert<double>((double)(float)this->m_f32Theta);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,",  Phi: ",8);
  poVar1 = std::ostream::_M_insert<double>((double)(float)this->m_f32Phi);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

KString EulerAngles::GetAsString() const
{
    KStringStream ss;

    ss << "Psi: "       << m_f32Psi
       << ",  Theta: "  << m_f32Theta
       << ",  Phi: "    << m_f32Phi << "\n";

    return ss.str();
}